

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadPaths(CrateReader *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  string local_1118;
  ostringstream local_10f8 [8];
  ostringstream ss_e_9;
  string local_f80;
  ostringstream local_f60 [8];
  ostringstream ss_e_8;
  string local_de8;
  ostringstream local_dc8 [8];
  ostringstream ss_e_7;
  string local_c50;
  ostringstream local_c30 [8];
  ostringstream ss_e_6;
  string local_ab8;
  ostringstream local_a98 [8];
  ostringstream ss_e_5;
  string local_920;
  ostringstream local_900 [8];
  ostringstream ss_e_4;
  string local_788;
  ostringstream local_768 [8];
  ostringstream ss_e_3;
  ulong local_5f0;
  uint64_t num_paths;
  ostringstream local_5c8 [8];
  ostringstream ss_e_2;
  Section *s;
  string local_428;
  string local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  ostringstream local_328 [8];
  ostringstream ss_e_1;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream ss_e;
  CrateReader *this_local;
  
  if ((this->_paths_index < 0) ||
     (lVar1 = this->_paths_index,
     sVar3 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             size(&(this->_toc).sections), (long)sVar3 <= lVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_190);
    poVar4 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x17f8);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_190,"Invalid index for `PATHS` section.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::ostringstream::~ostringstream(local_190);
    return false;
  }
  if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::ostringstream::ostringstream(local_328);
    poVar4 = ::std::operator<<((ostream *)local_328,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x17ff);
    ::std::operator<<(poVar4," ");
    ::std::__cxx11::to_string(&local_3e8,(uint)this->_version[0]);
    ::std::operator+((char *)&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Version must be 0.4.0 or later, but got ");
    ::std::operator+(&local_3a8,&local_3c8,".");
    ::std::__cxx11::to_string(&local_408,(uint)this->_version[1]);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_3a8);
    ::std::operator+(&local_368,&local_388,".");
    ::std::__cxx11::to_string(&local_428,(uint)this->_version[2]);
    ::std::operator+(local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368
                    );
    poVar4 = ::std::operator<<((ostream *)local_328,(string *)local_348);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::~string((string *)local_348);
    ::std::__cxx11::string::~string((string *)&local_428);
    ::std::__cxx11::string::~string((string *)&local_368);
    ::std::__cxx11::string::~string((string *)&local_388);
    ::std::__cxx11::string::~string((string *)&local_408);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3c8);
    ::std::__cxx11::string::~string((string *)&local_3e8);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&s);
    ::std::__cxx11::string::~string((string *)&s);
    ::std::__cxx11::ostringstream::~ostringstream(local_328);
    return false;
  }
  pvVar5 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
           operator[](&(this->_toc).sections,this->_paths_index);
  bVar2 = StreamReader::seek_set(this->_sr,pvVar5->start);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_5c8);
    poVar4 = ::std::operator<<((ostream *)local_5c8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1806);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_5c8,"Failed to move to `PATHS` section.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&num_paths);
    ::std::__cxx11::string::~string((string *)&num_paths);
    ::std::__cxx11::ostringstream::~ostringstream(local_5c8);
    return false;
  }
  bVar2 = StreamReader::read8(this->_sr,&local_5f0);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_768);
    poVar4 = ::std::operator<<((ostream *)local_768,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x180c);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_768,"Failed to read # of paths at `PATHS` section.")
    ;
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_788);
    ::std::__cxx11::string::~string((string *)&local_788);
    ::std::__cxx11::ostringstream::~ostringstream(local_768);
    return false;
  }
  if (local_5f0 == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_900);
    poVar4 = ::std::operator<<((ostream *)local_900,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1812);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_900,"`PATHS` is empty.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_920);
    ::std::__cxx11::string::~string((string *)&local_920);
    ::std::__cxx11::ostringstream::~ostringstream(local_900);
    return false;
  }
  if ((this->_config).maxNumPaths < local_5f0) {
    ::std::__cxx11::ostringstream::ostringstream(local_a98);
    poVar4 = ::std::operator<<((ostream *)local_a98,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1816);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_a98,"Too many Paths in `PATHS` section.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_ab8);
    ::std::__cxx11::string::~string((string *)&local_ab8);
    ::std::__cxx11::ostringstream::~ostringstream(local_a98);
    return false;
  }
  this->_memoryUsage = local_5f0 * 0xd0 + this->_memoryUsage;
  if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
    ::std::__cxx11::ostringstream::ostringstream(local_c30);
    poVar4 = ::std::operator<<((ostream *)local_c30,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1819);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_c30,"Reached to max memory budget.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_c50);
    ::std::__cxx11::string::~string((string *)&local_c50);
    ::std::__cxx11::ostringstream::~ostringstream(local_c30);
    return false;
  }
  this->_memoryUsage = local_5f0 * 0xd0 + this->_memoryUsage;
  if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
    ::std::__cxx11::ostringstream::ostringstream(local_dc8);
    poVar4 = ::std::operator<<((ostream *)local_dc8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x181a);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_dc8,"Reached to max memory budget.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_de8);
    ::std::__cxx11::string::~string((string *)&local_de8);
    ::std::__cxx11::ostringstream::~ostringstream(local_dc8);
    return false;
  }
  this->_memoryUsage = local_5f0 * 0x1f8 + this->_memoryUsage;
  if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
    ::std::__cxx11::ostringstream::ostringstream(local_f60);
    poVar4 = ::std::operator<<((ostream *)local_f60,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x181b);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_f60,"Reached to max memory budget.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_f80);
    ::std::__cxx11::string::~string((string *)&local_f80);
    ::std::__cxx11::ostringstream::~ostringstream(local_f60);
    return false;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize(&this->_paths,local_5f0);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize
            (&this->_elemPaths,local_5f0);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  resize(&this->_nodes,local_5f0);
  bVar2 = ReadCompressedPaths(this,local_5f0);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_10f8);
    poVar4 = ::std::operator<<((ostream *)local_10f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadPaths");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1822);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_10f8,"Failed to read compressed paths.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1118);
    ::std::__cxx11::string::~string((string *)&local_1118);
    ::std::__cxx11::ostringstream::~ostringstream(local_10f8);
    return false;
  }
  return true;
}

Assistant:

bool CrateReader::ReadPaths() {
  if ((_paths_index < 0) || (_paths_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `PATHS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_paths_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `PATHS` section.");
    return false;
  }

  uint64_t num_paths;
  if (!_sr->read8(&num_paths)) {
    PUSH_ERROR("Failed to read # of paths at `PATHS` section.");
    return false;
  }

  if (num_paths == 0) {
    // At least root path exits.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`PATHS` is empty.");
  }

  if (num_paths > _config.maxNumPaths) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Paths in `PATHS` section.");
  }

  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Path)); // conservative estimation
  CHECK_MEMORY_USAGE(size_t(num_paths) * sizeof(Node)); // conservative estimation

  _paths.resize(static_cast<size_t>(num_paths));
  _elemPaths.resize(static_cast<size_t>(num_paths));
  _nodes.resize(static_cast<size_t>(num_paths));

  if (!ReadCompressedPaths(num_paths)) {
    PUSH_ERROR("Failed to read compressed paths.");
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  DCOUT("# of paths " << _paths.size());

  for (size_t i = 0; i < _paths.size(); i++) {
    DCOUT("path[" << i << "] = " << _paths[i].full_path_name());
  }
#endif

  return true;
}